

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

void Gia_ManPerformFlow3(int nLutSize,int nCutNum,int fBalance,int fMinAve,int fUseMfs,
                        int fUseLutLib,int fVerbose)

{
  char *pcVar1;
  int iVar2;
  Abc_Frame_t *pAVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char Comm3 [200];
  char Comm2 [200];
  char Comm1 [200];
  char local_298 [208];
  char local_1c8 [208];
  char local_f8 [200];
  
  if (fUseLutLib == 0) {
    sprintf(local_f8,"&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load",
            nCutNum,(ulong)(uint)nLutSize,nCutNum,(ulong)(uint)nLutSize);
  }
  else {
    sprintf(local_f8,"&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load",
            nCutNum,nCutNum);
  }
  iVar2 = Abc_NtkRecIsRunning3();
  pcVar1 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
  pcVar5 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
  if (iVar2 == 0) {
    pcVar5 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
  }
  pcVar7 = "&mfs; ";
  pcVar6 = "&mfs; ";
  if (fUseMfs == 0) {
    pcVar6 = "";
  }
  if (fUseLutLib == 0) {
    sprintf(local_1c8,"&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load",pcVar5 + 0x4a,
            nCutNum,(ulong)(uint)nLutSize);
  }
  else {
    sprintf(local_1c8,"&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load",pcVar5 + 0x4a,
            nCutNum,pcVar6);
  }
  iVar2 = Abc_NtkRecIsRunning3();
  if (iVar2 == 0) {
    pcVar1 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
  }
  if (fUseMfs == 0) {
    pcVar7 = "";
  }
  if (fUseLutLib == 0) {
    sprintf(local_298,"&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load",pcVar1 + 0x4a,
            nCutNum,(ulong)(uint)nLutSize,pcVar7);
  }
  else {
    sprintf(local_298,"&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load",pcVar1 + 0x4a,
            nCutNum,pcVar7);
  }
  if (fVerbose == 0) {
    pcVar5 = local_f8;
  }
  else {
    iVar2 = Abc_NtkRecIsRunning3();
    pcVar5 = "LMS";
    if (iVar2 == 0) {
      pcVar5 = "SOP balancing";
    }
    printf("Trying simple synthesis with %s...\n",pcVar5);
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,local_f8);
    pcVar5 = "&ps";
  }
  pAVar3 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar3,pcVar5);
  pAVar3 = Abc_FrameGetGlobalFrame();
  pGVar4 = Abc_FrameReadGia(pAVar3);
  if (-0x30d41 < (pGVar4->vCis->nSize - pGVar4->nObjs) + pGVar4->vCos->nSize) {
    if (fVerbose == 0) {
      pcVar5 = local_1c8;
    }
    else {
      puts("Trying medium synthesis...");
      pAVar3 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar3,local_1c8);
      pcVar5 = "&ps";
    }
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,pcVar5);
  }
  pAVar3 = Abc_FrameGetGlobalFrame();
  pGVar4 = Abc_FrameReadGia(pAVar3);
  if (-0x2711 < (pGVar4->vCis->nSize - pGVar4->nObjs) + pGVar4->vCos->nSize) {
    if (fVerbose == 0) {
      pcVar5 = local_298;
    }
    else {
      puts("Trying harder synthesis...");
      pAVar3 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar3,local_298);
      pcVar5 = "&ps";
    }
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,pcVar5);
  }
  if (fVerbose != 0) {
    puts("Final result...");
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,"&ps");
  }
  return;
}

Assistant:

void Gia_ManPerformFlow3( int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fUseLutLib, int fVerbose )
{
    char Comm1[200], Comm2[200], Comm3[200];
    if ( fUseLutLib )
        sprintf( Comm1, "&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load", nCutNum, nCutNum );
    else
        sprintf( Comm1, "&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load", nCutNum, nLutSize, nCutNum, nLutSize );
    if ( fUseLutLib )
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );
    if ( fUseLutLib )
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );

    if ( fVerbose ) printf( "Trying simple synthesis with %s...\n", Abc_NtkRecIsRunning3() ? "LMS" : "SOP balancing" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm1 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 200000 )
    {
        if ( fVerbose ) printf( "Trying medium synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 10000 )
    {
        if ( fVerbose ) printf( "Trying harder synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( fVerbose ) printf( "Final result...\n" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
}